

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DebugCheckVersionAndDataLayout
               (char *version,size_t sz_io,size_t sz_style,size_t sz_vec2,size_t sz_vec4,
               size_t sz_vert,size_t sz_idx)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  long in_R8;
  long in_R9;
  bool error;
  byte local_31;
  
  local_31 = 0;
  iVar1 = strcmp(in_RDI,"1.77 WIP");
  if (iVar1 != 0) {
    local_31 = 1;
    iVar1 = strcmp(in_RDI,"1.77 WIP");
    if (iVar1 != 0) {
      __assert_fail("strcmp(version, \"1.77 WIP\") == 0 && \"Mismatched version string!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1a7d,
                    "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                   );
    }
  }
  if ((in_RSI != 0x1560) && (local_31 = 1, in_RSI != 0x1560)) {
    __assert_fail("sz_io == sizeof(ImGuiIO) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a7e,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  if ((in_RDX != 0x3b8) && (local_31 = 1, in_RDX != 0x3b8)) {
    __assert_fail("sz_style == sizeof(ImGuiStyle) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a7f,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  if ((in_RCX != 8) && (local_31 = 1, in_RCX != 8)) {
    __assert_fail("sz_vec2 == sizeof(ImVec2) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a80,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  if ((in_R8 != 0x10) && (local_31 = 1, in_R8 != 0x10)) {
    __assert_fail("sz_vec4 == sizeof(ImVec4) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a81,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  if ((in_R9 != 0x14) && (local_31 = 1, in_R9 != 0x14)) {
    __assert_fail("sz_vert == sizeof(ImDrawVert) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a82,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  if ((sz_vert != 4) && (local_31 = 1, sz_vert != 4)) {
    __assert_fail("sz_idx == sizeof(unsigned int) && \"Mismatched struct layout!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a83,
                  "bool ImGui::DebugCheckVersionAndDataLayout(const char *, size_t, size_t, size_t, size_t, size_t, size_t)"
                 );
  }
  return (bool)((local_31 ^ 0xff) & 1);
}

Assistant:

bool ImGui::DebugCheckVersionAndDataLayout(const char* version, size_t sz_io, size_t sz_style, size_t sz_vec2, size_t sz_vec4, size_t sz_vert, size_t sz_idx)
{
    bool error = false;
    if (strcmp(version, IMGUI_VERSION) != 0) { error = true; IM_ASSERT(strcmp(version, IMGUI_VERSION) == 0 && "Mismatched version string!"); }
    if (sz_io != sizeof(ImGuiIO)) { error = true; IM_ASSERT(sz_io == sizeof(ImGuiIO) && "Mismatched struct layout!"); }
    if (sz_style != sizeof(ImGuiStyle)) { error = true; IM_ASSERT(sz_style == sizeof(ImGuiStyle) && "Mismatched struct layout!"); }
    if (sz_vec2 != sizeof(ImVec2)) { error = true; IM_ASSERT(sz_vec2 == sizeof(ImVec2) && "Mismatched struct layout!"); }
    if (sz_vec4 != sizeof(ImVec4)) { error = true; IM_ASSERT(sz_vec4 == sizeof(ImVec4) && "Mismatched struct layout!"); }
    if (sz_vert != sizeof(ImDrawVert)) { error = true; IM_ASSERT(sz_vert == sizeof(ImDrawVert) && "Mismatched struct layout!"); }
    if (sz_idx != sizeof(ImDrawIdx)) { error = true; IM_ASSERT(sz_idx == sizeof(ImDrawIdx) && "Mismatched struct layout!"); }
    return !error;
}